

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extinfo.h
# Opt level: O2

void server::extserverinforeply(ucharbuf *req,ucharbuf *p)

{
  int iVar1;
  clientinfo *pcVar2;
  uint n;
  clientinfo *pcVar3;
  int i;
  int i_1;
  clientinfo *ci;
  long lVar4;
  ucharbuf q;
  
  iVar1 = getint(req);
  putint(p,-1);
  putint(p,0x69);
  if (iVar1 == 2) {
    extinfoteams(p);
  }
  else {
    if (iVar1 == 1) {
      iVar1 = getint(req);
      ci = (clientinfo *)0x0;
      if (-1 < iVar1) {
        pcVar2 = (clientinfo *)(ulong)DAT_00191854;
        if ((int)DAT_00191854 < 1) {
          pcVar2 = ci;
        }
        pcVar3 = (clientinfo *)0x0;
        do {
          if (pcVar2 == pcVar3) goto LAB_0013fd8a;
          ci = *(clientinfo **)(clients + (long)pcVar3 * 8);
          pcVar3 = (clientinfo *)((long)&pcVar3->ip + 1);
        } while (ci->clientnum != iVar1);
      }
      putint(p,0);
      q.flags = p->flags;
      q._17_7_ = *(undefined7 *)&p->field_0x11;
      q.buf = p->buf;
      q.len = p->len;
      q.maxlen = p->maxlen;
      putint(&q,-10);
      if (ci == (clientinfo *)0x0) {
        for (lVar4 = 0; lVar4 < (int)DAT_00191854; lVar4 = lVar4 + 1) {
          putint(&q,*(int *)(*(long *)(clients + lVar4 * 8) + 8));
        }
      }
      else {
        putint(&q,ci->clientnum);
      }
      sendserverinforeply(&q);
      if (ci == (clientinfo *)0x0) {
        for (lVar4 = 0; lVar4 < (int)DAT_00191854; lVar4 = lVar4 + 1) {
          extinfoplayer(p,*(clientinfo **)(clients + lVar4 * 8));
        }
      }
      else {
        extinfoplayer(p,ci);
      }
      return;
    }
    n = totalsecs;
    if (iVar1 != 0) {
LAB_0013fd8a:
      n = 1;
    }
    putint(p,n);
  }
  sendserverinforeply(p);
  return;
}

Assistant:

void extserverinforeply(ucharbuf &req, ucharbuf &p)
    {
        int extcmd = getint(req); // extended commands  

        //Build a new packet
        putint(p, EXT_ACK); //send ack
        putint(p, EXT_VERSION); //send version of extended info

        switch(extcmd)
        {
            case EXT_UPTIME:
            {
                putint(p, totalsecs); //in seconds
                break;
            }

            case EXT_PLAYERSTATS:
            {
                int cn = getint(req); //a special player, -1 for all
                
                clientinfo *ci = NULL;
                if(cn >= 0)
                {
                    loopv(clients) if(clients[i]->clientnum == cn) { ci = clients[i]; break; }
                    if(!ci)
                    {
                        putint(p, EXT_ERROR); //client requested by id was not found
                        sendserverinforeply(p);
                        return;
                    }
                }

                putint(p, EXT_NO_ERROR); //so far no error can happen anymore
                
                ucharbuf q = p; //remember buffer position
                putint(q, EXT_PLAYERSTATS_RESP_IDS); //send player ids following
                if(ci) putint(q, ci->clientnum);
                else loopv(clients) putint(q, clients[i]->clientnum);
                sendserverinforeply(q);
            
                if(ci) extinfoplayer(p, ci);
                else loopv(clients) extinfoplayer(p, clients[i]);
                return;
            }

            case EXT_TEAMSCORE:
            {
                extinfoteams(p);
                break;
            }

            default:
            {
                putint(p, EXT_ERROR);
                break;
            }
        }
        sendserverinforeply(p);
    }